

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr c4::yml::Parser::_prfl(substr buf,flag_t flags)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *s_;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong len_;
  csubstr cVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  basic_substring<char> local_38;
  undefined8 local_28;
  csubstr cStack_20;
  
  uVar4 = buf.len;
  s_ = buf.str;
  if ((flags & 1U) == 0) {
    len_ = 0;
    bVar2 = false;
  }
  else {
    bVar2 = true;
    len_ = 4;
    if (3 < uVar4) {
      builtin_strncpy(s_,"RTOP",4);
    }
  }
  if ((flags & 2U) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ | 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RUNK",4);
    }
  }
  if ((flags & 4U) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RMAP",4);
    }
  }
  if ((flags & 8U) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RSEQ",4);
    }
  }
  if ((flags & 0x10U) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"FLOW",4);
    }
  }
  if ((flags & 0x20U) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"QMRK",4);
    }
  }
  if ((flags & 0x40U) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RKEY",4);
    }
  }
  if ((char)flags < '\0') {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RVAL",4);
    }
  }
  if (((uint)flags >> 8 & 1) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RNXT",4);
    }
  }
  if (((uint)flags >> 9 & 1) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"SSCL",4);
    }
  }
  if (((uint)flags >> 10 & 1) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"QSCL",4);
    }
  }
  if (((uint)flags >> 0xb & 1) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RSET",4);
    }
  }
  if (((uint)flags >> 0xc & 1) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 4;
    bVar2 = true;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"NDOC",4);
    }
  }
  if (((uint)flags >> 0xd & 1) != 0) {
    uVar3 = len_;
    if ((bVar2) && (uVar3 = len_ + 1, uVar3 < uVar4)) {
      s_[len_] = '|';
    }
    len_ = uVar3 + 8;
    if (len_ <= uVar4) {
      builtin_strncpy(s_ + uVar3,"RSEQIMAP",8);
    }
  }
  if (len_ <= uVar4) {
    basic_substring<char>::basic_substring(&local_38,s_,len_);
    cVar5.str._4_4_ = local_38.str._4_4_;
    cVar5.str._0_4_ = local_38.str._0_4_;
    cVar5.len._0_4_ = (undefined4)local_38.len;
    cVar5.len._4_4_ = local_38.len._4_4_;
    return cVar5;
  }
  if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
    pcVar1 = (code *)swi(3);
    cVar5 = (csubstr)(*pcVar1)();
    return cVar5;
  }
  cStack_20 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
  local_38.str._0_4_ = 0;
  local_38.str._4_4_ = 0;
  local_38.len._0_4_ = 0x7f56;
  local_38.len._4_4_ = 0;
  local_28 = 0;
  local_28._0_4_ = 0;
  uVar6 = local_38.str._0_4_;
  uVar7 = (undefined4)local_38.len;
  uVar8 = (undefined4)local_28;
  uVar9 = cStack_20.str._0_4_;
  sVar10 = cStack_20.len;
  (*(code *)PTR_error_impl_00246018)
            ("check failed: pos <= buf.len",0x1c,(anonymous_namespace)::s_default_callbacks);
  if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
    pcVar1 = (code *)swi(3);
    cVar5 = (csubstr)(*pcVar1)();
    return cVar5;
  }
  handle_error(0x20a4ad,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x154e,"num <= len || num == npos",in_R8,in_R9,uVar6,uVar7,uVar8,uVar9,sVar10);
}

Assistant:

csubstr Parser::_prfl(substr buf, flag_t flags)
{
    size_t pos = 0;
    bool gotone = false;

    #define _prflag(fl)                                     \
    if((flags & fl) == (fl))                                \
    {                                                       \
        if(gotone)                                          \
        {                                                   \
            if(pos + 1 < buf.len)                           \
                buf[pos] = '|';                             \
            ++pos;                                          \
        }                                                   \
        csubstr fltxt = #fl;                                \
        if(pos + fltxt.len <= buf.len)                      \
            memcpy(buf.str + pos, fltxt.str, fltxt.len);    \
        pos += fltxt.len;                                   \
        gotone = true;                                      \
    }

    _prflag(RTOP);
    _prflag(RUNK);
    _prflag(RMAP);
    _prflag(RSEQ);
    _prflag(FLOW);
    _prflag(QMRK);
    _prflag(RKEY);
    _prflag(RVAL);
    _prflag(RNXT);
    _prflag(SSCL);
    _prflag(QSCL);
    _prflag(RSET);
    _prflag(NDOC);
    _prflag(RSEQIMAP);

    #undef _prflag

    RYML_ASSERT(pos <= buf.len);

    return buf.first(pos);
}